

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O2

sub_channel_info *
idx2::BinarySearch<idx2::sub_channel_info,idx2::sub_channel_info*>
          (sub_channel_info *Beg,sub_channel_info *End,sub_channel_info *Val)

{
  sub_channel_info *psVar1;
  char cVar2;
  char cVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  long lVar6;
  
  cVar2 = Val->Level;
  do {
    while( true ) {
      if (End <= Beg) {
        return End;
      }
      auVar4._8_8_ = (long)End - (long)Beg >> 0x3f;
      auVar4._0_8_ = (long)End - (long)Beg >> 4;
      lVar6 = SUB168(auVar4 / SEXT816(2),0);
      psVar1 = Beg + lVar6;
      cVar3 = Beg[lVar6].Level;
      bVar5 = cVar2 < cVar3;
      if (cVar3 == cVar2) {
        bVar5 = Beg[lVar6].Subband < Val->Subband;
      }
      if (!bVar5) break;
      Beg = psVar1 + 1;
    }
    bVar5 = cVar3 < cVar2;
    if (cVar2 == cVar3) {
      bVar5 = Val->Subband < Beg[lVar6].Subband;
    }
    End = psVar1;
  } while (bVar5);
  return psVar1;
}

Assistant:

i
BinarySearch(i Beg, i End, const t& Val)
{
  while (Beg < End)
  {
    i Mid = Beg + (End - Beg) / 2;
    if (*Mid < Val)
    {
      Beg = Mid + 1;
      continue;
    }
    else if (Val < *Mid)
    {
      End = Mid;
      continue;
    }
    return Mid;
  }
  return End;
}